

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::TypeBuilder::dump(TypeBuilder *this)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var1;
  HeapType type_00;
  pointer pHVar2;
  RecGroup RVar3;
  ostream *poVar4;
  bool bVar5;
  size_t i;
  ulong uVar6;
  undefined1 auVar7 [8];
  undefined1 local_140 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print;
  _Function_base local_a0;
  _Alloc_hider local_80;
  HeapType type;
  undefined1 auStack_58 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  allocator<char> local_31;
  
  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  for (uVar6 = 0;
      _Var1._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
           .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
      uVar6 < (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) -
                      *(long *)&((_Var1._M_head_impl)->entries).
                                super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
                     >> 4); uVar6 = uVar6 + 1) {
    local_140 = (undefined1  [8])this;
    print.defaultGenerator.funcCount = uVar6;
    local_80._M_p = (pointer)Entry::operator_cast_to_HeapType((Entry *)local_140);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
               (HeapType *)&stack0xffffffffffffff80);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff80,"",&local_31);
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
  IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
            ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_140,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58,
             (string *)&stack0xffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  pHVar2 = types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = false;
  for (auVar7 = auStack_58; auVar7 != (undefined1  [8])pHVar2;
      auVar7 = (undefined1  [8])((long)auVar7 + 8)) {
    type_00.id = ((pointer)auVar7)->id;
    local_80._M_p = (pointer)type_00.id;
    RVar3 = HeapType::getRecGroup((HeapType *)&stack0xffffffffffffff80);
    if ((bVar5 & (TypeBuilder *)RVar3.id == this) == 0) {
      if ((((~bVar5 | (byte)this) & 1) == 0) &&
         (8 < (ulong)((long)this[1].impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl -
                     (long)(this->impl)._M_t.
                           super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                           .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)))
      {
        std::operator<<((ostream *)&std::cerr,")\n");
      }
      if (((RVar3.id & 1) == 0) && (8 < (ulong)(*(long *)(RVar3.id + 8) - *(long *)RVar3.id))) {
        std::operator<<((ostream *)&std::cerr,"(rec\n");
      }
      this = (TypeBuilder *)RVar3;
      if (!bVar5) {
        bVar5 = true;
      }
    }
    if ((((ulong)this & 1) == 0) &&
       (8 < (ulong)((long)this[1].impl._M_t.
                          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl -
                   (long)(this->impl)._M_t.
                         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl))) {
      std::operator<<((ostream *)&std::cerr,"  ");
    }
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()((Printed *)&print.names._M_h._M_single_bucket,
               (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_140,type_00);
    poVar4 = wasm::operator<<((ostream *)&std::cerr,(Printed *)&print.names._M_h._M_single_bucket);
    std::operator<<(poVar4,"\n");
    std::_Function_base::~_Function_base(&local_a0);
  }
  if (((((ulong)this & 1) == 0 & bVar5) != 0) &&
     (8 < (ulong)((long)this[1].impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl -
                 (long)(this->impl)._M_t.
                       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl))) {
    std::operator<<((ostream *)&std::cerr,")\n");
  }
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::~IndexedTypeNameGenerator
            ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_140);
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_58);
  return;
}

Assistant:

void TypeBuilder::dump() {
  std::vector<HeapType> types;
  for (size_t i = 0; i < size(); ++i) {
    types.push_back((*this)[i]);
  }
  IndexedTypeNameGenerator<DefaultTypeNameGenerator> print(types);

  std::optional<RecGroup> currGroup;
  for (auto type : types) {
    if (auto newGroup = type.getRecGroup(); newGroup != currGroup) {
      if (currGroup && currGroup->size() > 1) {
        std::cerr << ")\n";
      }
      if (newGroup.size() > 1) {
        std::cerr << "(rec\n";
      }
      currGroup = newGroup;
    }
    if (currGroup->size() > 1) {
      std::cerr << "  ";
    }
    std::cerr << print(type) << "\n";
  }
  if (currGroup && currGroup->size() > 1) {
    std::cerr << ")\n";
  }
}